

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# graphics_threaded.cpp
# Opt level: O0

int __thiscall CGraphics_Threaded::Init(CGraphics_Threaded *this)

{
  long lVar1;
  int iVar2;
  IStorage *pIVar3;
  IConfigManager *pIVar4;
  undefined4 extraout_var;
  IConsole *pIVar5;
  IGraphicsBackend *pIVar6;
  CCommandBuffer *pCVar7;
  long in_FS_OFFSET;
  undefined4 in_stack_ffffffffffffef98;
  undefined4 in_stack_ffffffffffffef9c;
  IKernel *in_stack_ffffffffffffefa0;
  int y;
  int x;
  int i_1;
  int i;
  CGraphics_Threaded *this_local;
  int local_1010;
  uchar aNullTextureData [4096];
  
  aNullTextureData[8] = '\0';
  aNullTextureData[9] = '\0';
  aNullTextureData[10] = '\0';
  aNullTextureData[0xb] = '\0';
  aNullTextureData[0xc] = '\0';
  aNullTextureData[0xd] = '\0';
  aNullTextureData[0xe] = '\0';
  aNullTextureData[0xf] = '\0';
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  IInterface::Kernel((IInterface *)this);
  pIVar3 = IKernel::RequestInterface<IStorage>(in_stack_ffffffffffffefa0);
  this->m_pStorage = pIVar3;
  IInterface::Kernel((IInterface *)this);
  pIVar4 = IKernel::RequestInterface<IConfigManager>(in_stack_ffffffffffffefa0);
  iVar2 = (*(pIVar4->super_IInterface)._vptr_IInterface[6])();
  this->m_pConfig = (CConfig *)CONCAT44(extraout_var,iVar2);
  IInterface::Kernel((IInterface *)this);
  pIVar5 = IKernel::RequestInterface<IConsole>(in_stack_ffffffffffffefa0);
  this->m_pConsole = pIVar5;
  this->m_FirstFreeTexture = 0;
  for (i = 0; i < 0xfff; i = i + 1) {
    this->m_aTextureIndices[i] = i + 1;
  }
  this->m_aTextureIndices[0xfff] = -1;
  pIVar6 = CreateGraphicsBackend();
  this->m_pBackend = pIVar6;
  iVar2 = InitWindow((CGraphics_Threaded *)
                     CONCAT44(in_stack_ffffffffffffef9c,in_stack_ffffffffffffef98));
  if (iVar2 == 0) {
    *(float *)&this->field_0x20 =
         (float)*(int *)&this->field_0x10 / (float)this->m_pConfig->m_GfxScreenWidth;
    for (i_1 = 0; i_1 < 2; i_1 = i_1 + 1) {
      pCVar7 = (CCommandBuffer *)operator_new(0x30);
      CCommandBuffer::CCommandBuffer
                ((CCommandBuffer *)this,(uint)((ulong)pCVar7 >> 0x20),(uint)pCVar7);
      this->m_apCommandBuffers[i_1] = pCVar7;
    }
    this->m_pCommandBuffer = this->m_apCommandBuffers[0];
    for (x = 0; x < 0x20; x = x + 1) {
      for (y = 0; y < 0x20; y = y + 1) {
        if (x < 0x10) {
          if (y < 0x10) {
            aNullTextureData[(y * 0x20 + x) * 4] = (char)(y << 3) + (char)(x << 3) + '\x0f';
            aNullTextureData[(y * 0x20 + x) * 4 + 1] = '\0';
            aNullTextureData[(y * 0x20 + x) * 4 + 2] = '\0';
          }
          else {
            aNullTextureData[(y * 0x20 + x) * 4] = '\0';
            aNullTextureData[(y * 0x20 + x) * 4 + 1] = (char)(y << 3) + (char)(x << 3) + 0x8f;
            aNullTextureData[(y * 0x20 + x) * 4 + 2] = '\0';
          }
        }
        else if (y < 0x10) {
          aNullTextureData[(y * 0x20 + x) * 4] = '\0';
          aNullTextureData[(y * 0x20 + x) * 4 + 1] = '\0';
          aNullTextureData[(y * 0x20 + x) * 4 + 2] = (char)(y << 3) + (char)(x << 3) + 0x8f;
        }
        else {
          aNullTextureData[(y * 0x20 + x) * 4] = (char)(y << 3) + (char)(x << 3) + '\x10';
          aNullTextureData[(y * 0x20 + x) * 4 + 1] = (char)(y << 3) + (char)(x << 3) + '\x10';
          aNullTextureData[(y * 0x20 + x) * 4 + 2] = '\0';
        }
        aNullTextureData[(y * 0x20 + x) * 4 + 3] = 0xff;
      }
    }
    iVar2 = (**(code **)(*(long *)this + 0x80))(this,0x20,0x20,1,aNullTextureData,1,9);
    (this->m_InvalidTexture).m_Id = iVar2;
    local_1010 = 0;
  }
  else {
    local_1010 = -1;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_1010;
}

Assistant:

int CGraphics_Threaded::Init()
{
	// fetch pointers
	m_pStorage = Kernel()->RequestInterface<IStorage>();
	m_pConfig = Kernel()->RequestInterface<IConfigManager>()->Values();
	m_pConsole = Kernel()->RequestInterface<IConsole>();

	// init textures
	m_FirstFreeTexture = 0;
	for(int i = 0; i < MAX_TEXTURES-1; i++)
		m_aTextureIndices[i] = i+1;
	m_aTextureIndices[MAX_TEXTURES-1] = -1;

	m_pBackend = CreateGraphicsBackend();
	if(InitWindow() != 0)
		return -1;

	m_ScreenHiDPIScale = m_ScreenWidth / (float)m_pConfig->m_GfxScreenWidth;

	// create command buffers
	for(int i = 0; i < NUM_CMDBUFFERS; i++)
		m_apCommandBuffers[i] = new CCommandBuffer(128*1024, 2*1024*1024);
	m_pCommandBuffer = m_apCommandBuffers[0];

	// create null texture, will get id=0
	unsigned char aNullTextureData[4*32*32];
	for(int x = 0; x < 32; ++x)
		for(int y = 0; y < 32; ++y)
		{
			if(x < 16)
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8+15;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-113;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			else
			{
				if(y < 16)
				{
					aNullTextureData[4*(y*32+x)+0] = 0;
					aNullTextureData[4*(y*32+x)+1] = 0;
					aNullTextureData[4*(y*32+x)+2] = y*8+x*8-113;
				}
				else
				{
					aNullTextureData[4*(y*32+x)+0] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+1] = y*8+x*8-496;
					aNullTextureData[4*(y*32+x)+2] = 0;
				}
			}
			aNullTextureData[4*(y*32+x)+3] = 255;
		}

	m_InvalidTexture = LoadTextureRaw(32,32,CImageInfo::FORMAT_RGBA,aNullTextureData,CImageInfo::FORMAT_RGBA,TEXLOAD_NORESAMPLE|TEXLOAD_MULTI_DIMENSION);
	return 0;
}